

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmAuxTableULT.h
# Opt level: O0

int __thiscall CTestAuxTable::Surface::init(Surface *this,EVP_PKEY_CTX *ctx)

{
  GMM_GFX_ADDRESS GVar1;
  GMM_CLIENT_CONTEXT *pGVar2;
  char cVar3;
  int iVar4;
  GMM_RESOURCE_INFO *pGVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  size_t sVar9;
  uint local_108 [2];
  GMM_REQ_OFFSET_INFO ReqInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  size_t alignment;
  size_t size;
  Surface *this_local;
  
  memset(&ReqInfo.StdLayout.TileDepthPitch,0,0x80);
  ReqInfo.StdLayout.TileDepthPitch._0_4_ = 2;
  ReqInfo.StdLayout.TileDepthPitch._4_4_ = 0x15d;
  pGVar5 = (GMM_RESOURCE_INFO *)
           (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                     (CommonULT::pGmmULTClientContext,&ReqInfo.StdLayout.TileDepthPitch);
  this->mResInfo = pGVar5;
  lVar6 = (**(code **)(*(long *)this->mResInfo + 0x288))();
  lVar7 = (**(code **)(*(long *)this->mResInfo + 0x118))();
  iVar4 = 0x10000;
  if (((uint)((ulong)*(undefined8 *)(lVar7 + 8) >> 0x25) & 1) != 0) {
    iVar4 = 0x4000;
  }
  lVar7 = (long)iVar4;
  pvVar8 = (void *)aligned_alloc(lVar7,lVar6 + lVar7 + -1 & (lVar7 - 1U ^ 0xffffffffffffffff));
  this->mBuf = pvVar8;
  if ((this->mResInfo == (GMM_RESOURCE_INFO *)0x0) || (this->mBuf == (void *)0x0)) {
    this_local._7_1_ = 0;
  }
  else {
    this->mYBase = (GMM_GFX_ADDRESS)this->mBuf;
    this->mUVBase = 0;
    GVar1 = this->mYBase;
    lVar6 = (**(code **)(*(long *)this->mResInfo + 0x2a0))(this->mResInfo,1);
    this->mAuxYBase = GVar1 + lVar6;
    this->mAuxUVBase = 0;
    sVar9 = (**(code **)(*(long *)this->mResInfo + 0x280))();
    this->mYPlaneSize = sVar9;
    pGVar2 = CommonULT::pGmmULTClientContext;
    (**(code **)(*(long *)this->mResInfo + 0x128))();
    cVar3 = (**(code **)(*(long *)pGVar2 + 0x98))();
    if (cVar3 != '\0') {
      memset(local_108,0,0x60);
      ReqInfo.Slice = 2;
      local_108[0] = local_108[0] & 0xfffffffe | 1;
      (**(code **)(*(long *)this->mResInfo + 0x68))(this->mResInfo,local_108);
      this->mYPlaneSize = ReqInfo.Lock._8_8_;
      this->mUVBase = this->mYBase + this->mYPlaneSize;
      GVar1 = this->mYBase;
      lVar6 = (**(code **)(*(long *)this->mResInfo + 0x2a0))(this->mResInfo,3);
      this->mAuxUVBase = GVar1 + lVar6;
    }
    lVar6 = (**(code **)(*(long *)this->mResInfo + 0x280))();
    this->mUVPlaneSize = lVar6 - this->mYPlaneSize;
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool init()
        {
            size_t size;
            size_t alignment;

            GMM_RESCREATE_PARAMS gmmParams       = {};
            gmmParams.Type                       = RESOURCE_2D;
            gmmParams.Format                     = GMM_FORMAT_NV12;
            gmmParams.BaseWidth                  = mWidth;
            gmmParams.BaseHeight                 = mHeight;
            gmmParams.Depth                      = 0x1;
            gmmParams.ArraySize                  = 1;
            gmmParams.Flags.Info.TiledY          = 1;
            gmmParams.Flags.Info.MediaCompressed = mMMC ? 1 : 0;
            //gmmParams.Flags.Gpu.CCS               = mmc ? 1 : 0;
            gmmParams.Flags.Gpu.MMC               = mMMC ? 1 : 0;
            gmmParams.Flags.Gpu.Texture           = 1;
            gmmParams.Flags.Gpu.RenderTarget      = 1;
            gmmParams.Flags.Gpu.UnifiedAuxSurface = mMMC ? 1 : 0;
            //gmmParams.Flags.Gpu.Depth             = 1;
            gmmParams.Flags.Gpu.Video = true;

            mResInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            size = mResInfo->GetSizeSurface();

            alignment = mResInfo->GetResFlags().Info.TiledYf ? GMM_KBYTE(16) : GMM_KBYTE(64);

            mBuf = aligned_alloc(alignment, ALIGN(size, alignment));

            if(!mResInfo || !mBuf)
                return false;

            mYBase      = (GMM_GFX_ADDRESS)mBuf;
            mUVBase     = 0;
            mAuxYBase   = mYBase + mResInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS);
            mAuxUVBase  = 0;
            mYPlaneSize = mResInfo->GetSizeMainSurface();

            if(pGmmULTClientContext->IsPlanar(mResInfo->GetResourceFormat()))
            {
                GMM_REQ_OFFSET_INFO ReqInfo = {0};
                ReqInfo.Plane               = GMM_PLANE_U;
                ReqInfo.ReqRender           = 1;

                mResInfo->GetOffset(ReqInfo);
                mYPlaneSize = ReqInfo.Render.Offset64;

                mUVBase    = mYBase + mYPlaneSize;
                mAuxUVBase = mYBase + mResInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS);
            }

            mUVPlaneSize = mResInfo->GetSizeMainSurface() - mYPlaneSize;

            return true;
        }